

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O1

void Diligent::CorrectGraphicsPipelineDesc
               (GraphicsPipelineDesc *GraphicsPipeline,DeviceFeatures *Features)

{
  Bool BVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  BlendStateDesc *BlendDesc;
  byte bVar5;
  
  if (GraphicsPipeline->NumRenderTargets < 8) {
    uVar2 = (ulong)((uint)GraphicsPipeline->NumRenderTargets * 2);
    memset((void *)((long)GraphicsPipeline->RTVFormats + uVar2),0,0x10 - uVar2);
  }
  BVar1 = (GraphicsPipeline->BlendDesc).IndependentBlendEnable;
  lVar3 = 0;
  do {
    if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].BlendEnable)[lVar3] == true) {
      bVar5 = lVar3 == 0 | BVar1;
    }
    else {
      bVar5 = 0;
    }
    if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].LogicOperationEnable)[lVar3] == true) {
      bVar4 = lVar3 == 0 | BVar1;
    }
    else {
      bVar4 = 0;
    }
    if ((bVar5 & 1) == 0) {
      if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].SrcBlend)[lVar3] ==
          BLEND_FACTOR_UNDEFINED) {
        (&(GraphicsPipeline->BlendDesc).RenderTargets[0].SrcBlend)[lVar3] = BLEND_FACTOR_ONE;
      }
      if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].DestBlend)[lVar3] ==
          BLEND_FACTOR_UNDEFINED) {
        (&(GraphicsPipeline->BlendDesc).RenderTargets[0].DestBlend)[lVar3] = BLEND_FACTOR_ZERO;
      }
      if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].BlendOp)[lVar3] ==
          BLEND_OPERATION_UNDEFINED) {
        (&(GraphicsPipeline->BlendDesc).RenderTargets[0].BlendOp)[lVar3] = BLEND_OPERATION_ADD;
      }
      if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].SrcBlendAlpha)[lVar3] ==
          BLEND_FACTOR_UNDEFINED) {
        (&(GraphicsPipeline->BlendDesc).RenderTargets[0].SrcBlendAlpha)[lVar3] = BLEND_FACTOR_ONE;
      }
      if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].DestBlendAlpha)[lVar3] ==
          BLEND_FACTOR_UNDEFINED) {
        (&(GraphicsPipeline->BlendDesc).RenderTargets[0].DestBlendAlpha)[lVar3] = BLEND_FACTOR_ZERO;
      }
      if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].BlendOpAlpha)[lVar3] ==
          BLEND_OPERATION_UNDEFINED) {
        (&(GraphicsPipeline->BlendDesc).RenderTargets[0].BlendOpAlpha)[lVar3] = BLEND_OPERATION_ADD;
      }
    }
    if ((bVar4 & 1) == 0) {
      (&(GraphicsPipeline->BlendDesc).RenderTargets[0].LogicOp)[lVar3] = LOGIC_OP_NOOP;
    }
    lVar3 = lVar3 + 10;
  } while (lVar3 != 0x50);
  if (((GraphicsPipeline->RasterizerDesc).DepthClipEnable == false) &&
     (Features->DepthClamp == DEVICE_FEATURE_STATE_DISABLED)) {
    (GraphicsPipeline->RasterizerDesc).DepthClipEnable = true;
  }
  if (((GraphicsPipeline->DepthStencilDesc).DepthEnable == false) &&
     ((GraphicsPipeline->DepthStencilDesc).DepthFunc == COMPARISON_FUNC_UNKNOWN)) {
    (GraphicsPipeline->DepthStencilDesc).DepthFunc = COMPARISON_FUNC_LESS;
  }
  BVar1 = (GraphicsPipeline->DepthStencilDesc).StencilEnable;
  if (BVar1 == false) {
    if ((GraphicsPipeline->DepthStencilDesc).FrontFace.StencilFailOp == STENCIL_OP_UNDEFINED) {
      (GraphicsPipeline->DepthStencilDesc).FrontFace.StencilFailOp = STENCIL_OP_KEEP;
    }
    if ((GraphicsPipeline->DepthStencilDesc).FrontFace.StencilDepthFailOp == STENCIL_OP_UNDEFINED) {
      (GraphicsPipeline->DepthStencilDesc).FrontFace.StencilDepthFailOp = STENCIL_OP_KEEP;
    }
    if ((GraphicsPipeline->DepthStencilDesc).FrontFace.StencilPassOp == STENCIL_OP_UNDEFINED) {
      (GraphicsPipeline->DepthStencilDesc).FrontFace.StencilPassOp = STENCIL_OP_KEEP;
    }
    if ((GraphicsPipeline->DepthStencilDesc).FrontFace.StencilFunc == COMPARISON_FUNC_UNKNOWN) {
      (GraphicsPipeline->DepthStencilDesc).FrontFace.StencilFunc = COMPARISON_FUNC_ALWAYS;
    }
  }
  if (BVar1 == false) {
    if ((GraphicsPipeline->DepthStencilDesc).BackFace.StencilFailOp == STENCIL_OP_UNDEFINED) {
      (GraphicsPipeline->DepthStencilDesc).BackFace.StencilFailOp = STENCIL_OP_KEEP;
    }
    if ((GraphicsPipeline->DepthStencilDesc).BackFace.StencilDepthFailOp == STENCIL_OP_UNDEFINED) {
      (GraphicsPipeline->DepthStencilDesc).BackFace.StencilDepthFailOp = STENCIL_OP_KEEP;
    }
    if ((GraphicsPipeline->DepthStencilDesc).BackFace.StencilPassOp == STENCIL_OP_UNDEFINED) {
      (GraphicsPipeline->DepthStencilDesc).BackFace.StencilPassOp = STENCIL_OP_KEEP;
    }
    if ((GraphicsPipeline->DepthStencilDesc).BackFace.StencilFunc == COMPARISON_FUNC_UNKNOWN) {
      (GraphicsPipeline->DepthStencilDesc).BackFace.StencilFunc = COMPARISON_FUNC_ALWAYS;
    }
  }
  return;
}

Assistant:

void CorrectGraphicsPipelineDesc(GraphicsPipelineDesc& GraphicsPipeline, const DeviceFeatures& Features) noexcept
{
    for (size_t rt = GraphicsPipeline.NumRenderTargets; rt < _countof(GraphicsPipeline.RTVFormats); ++rt)
        GraphicsPipeline.RTVFormats[rt] = TEX_FORMAT_UNKNOWN;

    CorrectBlendStateDesc(GraphicsPipeline);
    CorrectRasterizerStateDesc(GraphicsPipeline, Features);
    CorrectDepthStencilDesc(GraphicsPipeline);
}